

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5RenameMethod(sqlite3_vtab *pVtab,char *zName)

{
  int iVar1;
  Fts5FullTable *pTab;
  char *zName_local;
  sqlite3_vtab *pVtab_local;
  
  iVar1 = sqlite3Fts5StorageRename((Fts5Storage *)pVtab[1].zErrMsg,zName);
  return iVar1;
}

Assistant:

static int fts5RenameMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  const char *zName               /* New name of table */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  return sqlite3Fts5StorageRename(pTab->pStorage, zName);
}